

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

MethodHandle * __thiscall
jsonrpccxx::GetHandle<SomeClassConst,int,int,int>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          offset_in_SomeClassConst_to_subr method,SomeClassConst *instance)

{
  function<int_(int,_int)> *f;
  function<int_(int,_int)> function;
  function<int_(int,_int)> fStack_68;
  function<int_(int,_int)> local_48;
  anon_class_24_2_b747b145 local_28;
  
  local_28.instance = instance;
  local_28.method = (offset_in_SomeClassConst_to_subr)this;
  local_28._16_8_ = method;
  std::function<int(int,int)>::
  function<jsonrpccxx::GetHandle<SomeClassConst,int,int,int>(int(SomeClassConst::*)(int,int)const,SomeClassConst_const&)::_lambda(int&&,int&&)_1_,void>
            ((function<int(int,int)> *)&local_48,&local_28);
  std::function<int_(int,_int)>::function(&fStack_68,&local_48);
  GetHandle<int,int,int>(__return_storage_ptr__,(jsonrpccxx *)&fStack_68,f);
  std::_Function_base::~_Function_base(&fStack_68.super__Function_base);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(ReturnType (T::*method)(ParamTypes...) const, const T &instance)
  {
      std::function<ReturnType(ParamTypes...)> function = [&instance, method](ParamTypes &&...params) -> ReturnType {
          return (instance.*method)(std::forward<ParamTypes>(params)...);
      };
      return GetHandle(function);
  }